

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

void __thiscall lest::confirm::~confirm(confirm *this)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_1a9;
  string local_1a8 [32];
  string local_188 [32];
  text local_168 [39];
  allocator local_141;
  string local_140 [32];
  string local_120 [32];
  lest local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [32];
  text local_98 [39];
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  lest local_30 [32];
  confirm *local_10;
  confirm *this_local;
  
  local_10 = this;
  if (this->failures < 1) {
    bVar1 = env::pass(&this->output);
    if (bVar1) {
      poVar2 = std::operator<<((this->super_action).os,"All ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->selected);
      poVar2 = std::operator<<(poVar2," selected ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"test",&local_141);
      std::__cxx11::string::string(local_120,local_140);
      pluralise(local_100,(text *)local_120,this->selected);
      poVar2 = std::operator<<(poVar2,(string *)local_100);
      poVar2 = std::operator<<(poVar2," ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a8,"passed.\n",&local_1a9);
      std::__cxx11::string::string(local_188,local_1a8);
      colourise(local_168);
      std::operator<<(poVar2,(string *)local_168);
      std::__cxx11::string::~string((string *)local_168);
      std::__cxx11::string::~string(local_188);
      std::__cxx11::string::~string(local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      std::__cxx11::string::~string((string *)local_100);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
    }
  }
  else {
    poVar2 = (ostream *)std::ostream::operator<<((this->super_action).os,this->failures);
    poVar2 = std::operator<<(poVar2," out of ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->selected);
    poVar2 = std::operator<<(poVar2," selected ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"test",&local_71);
    std::__cxx11::string::string(local_50,local_70);
    pluralise(local_30,(text *)local_50,this->selected);
    poVar2 = std::operator<<(poVar2,(string *)local_30);
    poVar2 = std::operator<<(poVar2," ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"failed.\n",&local_d9);
    std::__cxx11::string::string(local_b8,local_d8);
    colourise(local_98);
    std::operator<<(poVar2,(string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string((string *)local_30);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  env::~env(&this->output);
  return;
}

Assistant:

~confirm()
    {
        if ( failures > 0 )
        {
            os << failures << " out of " << selected << " selected " << pluralise("test", selected) << " " << colourise( "failed.\n" );
        }
        else if ( output.pass() )
        {
            os << "All " << selected << " selected " << pluralise("test", selected) << " " << colourise( "passed.\n" );
        }
    }